

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

bool __thiscall Potassco::AspifTextInput::match(AspifTextInput *this,char *term,bool req)

{
  bool bVar1;
  BufferedStream *pBVar2;
  StringBuilder *this_00;
  char *msg;
  StringBuilder SStack_68;
  
  pBVar2 = ProgramReader::stream(&this->super_ProgramReader);
  bVar1 = BufferedStream::match(pBVar2,term);
  if (bVar1) {
    pBVar2 = ProgramReader::stream(&this->super_ProgramReader);
    BufferedStream::skipWs(pBVar2);
  }
  else {
    StringBuilder::StringBuilder(&SStack_68);
    this_00 = StringBuilder::appendFormat(&SStack_68,"\'%s\' expected",term);
    msg = StringBuilder::c_str(this_00);
    ProgramReader::require(&this->super_ProgramReader,!req,msg);
    StringBuilder::~StringBuilder(&SStack_68);
  }
  return bVar1;
}

Assistant:

bool AspifTextInput::match(const char* term, bool req) {
	if (ProgramReader::match(term, false)) { skipws(); return true; }
	require(!req, POTASSCO_FORMAT("'%s' expected", term));
	return false;
}